

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_table_driven_lite.h
# Opt level: O1

bool google::protobuf::internal::
     HandleEnum<google::protobuf::internal::(anonymous_namespace)::UnknownFieldHandler,(google::protobuf::internal::Cardinality)0>
               (ParseTable *table,CodedInputStream *input,MessageLite *msg,uint32 *presence,
               uint32 presence_index,int64 offset,uint32 tag,int field_number)

{
  byte bVar1;
  byte *pbVar2;
  EnumValidator p_Var3;
  bool bVar4;
  ulong uVar5;
  LogMessage *other;
  uint32 first_byte_or_zero;
  int value;
  bool bVar6;
  LogMessage local_80;
  int64 local_48;
  MessageLite *local_40;
  LogFinisher local_31;
  
  pbVar2 = input->buffer_;
  local_48 = offset;
  local_40 = msg;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar5 = (ulong)bVar1;
    first_byte_or_zero = (uint32)bVar1;
    if (-1 < (char)bVar1) {
      input->buffer_ = pbVar2 + 1;
      bVar6 = true;
      goto LAB_002de7a9;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  uVar5 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
  bVar6 = -1 < (long)uVar5;
LAB_002de7a9:
  if (bVar6 != false) {
    p_Var3 = table->aux[field_number].enums.validator;
    value = (int)uVar5;
    if ((p_Var3 != (EnumValidator)0x0) && (bVar4 = (*p_Var3)(value), !bVar4)) {
      anon_unknown_16::UnknownFieldHandler::Varint(local_40,table,tag,value);
      return bVar6;
    }
    if (presence == (uint32 *)0x0) {
      LogMessage::LogMessage
                (&local_80,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/generated_message_table_driven_lite.h"
                 ,0x76);
      other = LogMessage::operator<<(&local_80,"CHECK failed: has_bits != nullptr: ");
      LogFinisher::operator=(&local_31,other);
      LogMessage::~LogMessage(&local_80);
    }
    presence[presence_index >> 5] =
         presence[presence_index >> 5] | 1 << ((byte)presence_index & 0x1f);
    *(int *)((long)&local_40->_vptr_MessageLite + local_48) = value;
  }
  return bVar6;
}

Assistant:

inline bool HandleEnum(const ParseTable& table, io::CodedInputStream* input,
                       MessageLite* msg, uint32* presence,
                       uint32 presence_index, int64 offset, uint32 tag,
                       int field_number) {
  int value;
  if (PROTOBUF_PREDICT_FALSE(
          (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
              input, &value)))) {
    return false;
  }

  AuxillaryParseTableField::EnumValidator validator =
      table.aux[field_number].enums.validator;
  if (validator == nullptr || validator(value)) {
    switch (cardinality) {
      case Cardinality_SINGULAR:
        SetField(msg, presence, presence_index, offset, value);
        break;
      case Cardinality_REPEATED:
        AddField(msg, offset, value);
        break;
      case Cardinality_ONEOF:
        ClearOneofField(table.fields[presence[presence_index]], msg->GetArena(),
                        msg);
        SetOneofField(msg, presence, presence_index, offset, field_number,
                      value);
        break;
      default:
        PROTOBUF_ASSUME(false);
    }
  } else {
    UnknownFieldHandler::Varint(msg, table, tag, value);
  }

  return true;
}